

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_grouping(lysc_ctx *ctx,lysp_node *pnode,lysp_node_grp *grp)

{
  char *pcVar1;
  lysp_node_grp *plVar2;
  uint16_t uVar3;
  LY_ERR LVar4;
  int iVar5;
  uint32_t uVar6;
  char *__fmt;
  lysp_node *plVar7;
  long lVar8;
  void *pvVar9;
  char *local_118;
  char *path;
  lysp_node_grp *local_108;
  anon_union_64_2_4724e097_for_lysp_node_uses_0 local_100;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  lysc_node_container fake_container;
  
  local_100.node.next = (lysp_node *)0x0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_100.node.exts = (lysp_ext_instance *)0x0;
  uStack_c0 = 0;
  local_100.node.ref = (char *)0x0;
  local_100.node.iffeatures = (lysp_qname *)0x0;
  local_100.node.dsc = (char *)0x0;
  local_100._8_8_ = (ulong)CONCAT22((grp->field_0).node.flags,0x800) & 0xffffffff001cffff;
  local_100.node.name = (grp->field_0).node.name;
  fake_container.field_0.node.prev = (lysc_node *)&fake_container;
  fake_container.when = (lysc_when **)0x0;
  fake_container.actions = (lysc_node_action *)0x0;
  fake_container.child = (lysc_node *)0x0;
  fake_container.musts = (lysc_must *)0x0;
  fake_container.field_0.node.exts = (lysc_ext_instance *)0x0;
  fake_container.field_0.node.priv = (void *)0x0;
  fake_container.field_0.node.dsc = (char *)0x0;
  fake_container.field_0.node.ref = (char *)0x0;
  fake_container.notifs = (lysc_node_notif *)0x0;
  fake_container.field_0.node.parent = (lysc_node *)0x0;
  fake_container.field_0.node.next = (lysc_node *)0x0;
  fake_container.field_0._0_8_ = 1;
  fake_container.field_0.node.module = ctx->cur_mod;
  fake_container.field_0.node.name = "fake";
  if (pnode == (lysp_node *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = pnode->flags;
  }
  local_100.node.parent = pnode;
  LVar4 = lys_compile_node_flags(ctx,uVar3,0,(lysc_node *)&fake_container);
  if (LVar4 == LY_SUCCESS) {
    local_108 = grp;
    if ((grp->field_0).node.parent == (lysp_node *)0x0) {
      plVar7 = (lysp_node *)0x0;
    }
    else {
      ly_log(ctx->ctx,LY_LLWRN,LY_SUCCESS,"Locally scoped grouping \"%s\" not used.");
      plVar7 = (grp->field_0).node.parent;
    }
    path = (char *)0x0;
    uVar6 = 0;
    while ((pcVar1 = path, plVar7 != (lysp_node *)0x0 && (-1 < (int)uVar6))) {
      uVar3 = plVar7->nodetype;
      if (uVar3 == 0x8000) {
        __fmt = "{augment=\'%s\'}";
LAB_00146e4a:
        iVar5 = asprintf(&local_118,__fmt);
        if (iVar5 == -1) goto LAB_00146ef1;
      }
      else {
        if (uVar3 == 0x4000) {
          __fmt = "{grouping=\'%s\'}";
          goto LAB_00146e4a;
        }
        if (uVar3 == 0x800) {
          __fmt = "{uses=\'%s\'}";
          goto LAB_00146e4a;
        }
        local_118 = strdup(plVar7->name);
      }
      if (plVar7->parent == (lysp_node *)0x0) {
        uVar6 = asprintf(&path,"/%s:%s%s",ctx->cur_mod->name);
      }
      else {
        uVar6 = asprintf(&path,"/%s%s",local_118);
      }
      free(pcVar1);
      free(local_118);
      plVar7 = plVar7->parent;
    }
    if ((int)uVar6 < 0) {
      free(path);
      path = (char *)0x0;
LAB_00146ef1:
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_grouping");
      return LY_EMEM;
    }
    if (uVar6 == 0) {
      path = strdup("/");
      uVar6 = 1;
    }
    plVar2 = local_108;
    pcVar1 = path;
    strncpy(ctx->path,path,0xfed);
    ctx->path_len = uVar6;
    free(pcVar1);
    lysc_update_path(ctx,(lys_module *)0x0,"{grouping}");
    lysc_update_path(ctx,(lys_module *)0x0,(plVar2->field_0).node.name);
    LVar4 = lys_compile_uses(ctx,(lysp_node_uses *)&local_100.node,(lysc_node *)&fake_container,0,
                             (ly_set *)0x0);
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    ctx->path_len = 1;
    ctx->path[1] = '\0';
  }
  lysc_node_container_free(&ctx->free_ctx,&fake_container);
  lVar8 = 0;
  pvVar9 = (void *)0x0;
  while( true ) {
    if (fake_container.field_0.node.exts == (lysc_ext_instance *)0x0) {
      return LVar4;
    }
    if (fake_container.field_0.node.exts[-1].compiled <= pvVar9) break;
    lysc_ext_instance_free
              (&ctx->free_ctx,
               (lysc_ext_instance *)((long)&(fake_container.field_0.node.exts)->def + lVar8));
    pvVar9 = (void *)((long)pvVar9 + 1);
    lVar8 = lVar8 + 0x48;
  }
  free(&fake_container.field_0.node.exts[-1].compiled);
  return LVar4;
}

Assistant:

LY_ERR
lys_compile_grouping(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysp_node_grp *grp)
{
    LY_ERR rc = LY_SUCCESS;
    char *path;
    int len;

    /* use grouping status to avoid errors */
    struct lysp_node_uses fake_uses = {
        .parent = pnode,
        .nodetype = LYS_USES,
        .flags = grp->flags & LYS_STATUS_MASK, .next = NULL,
        .name = grp->name,
        .dsc = NULL, .ref = NULL, .when = NULL, .iffeatures = NULL, .exts = NULL,
        .refines = NULL, .augments = NULL
    };
    struct lysc_node_container fake_container = {
        .nodetype = LYS_CONTAINER,
        .flags = 0,
        .module = ctx->cur_mod,
        .parent = NULL, .next = NULL,
        .prev = &fake_container.node,
        .name = "fake",
        .dsc = NULL, .ref = NULL, .exts = NULL, .when = NULL,
        .child = NULL, .musts = NULL, .actions = NULL, .notifs = NULL
    };

    /* compile fake container flags */
    LY_CHECK_GOTO(rc = lys_compile_node_flags(ctx, pnode ? pnode->flags : 0, 0, &fake_container.node), cleanup);

    if (grp->parent) {
        LOGWRN(ctx->ctx, "Locally scoped grouping \"%s\" not used.", grp->name);
    }

    len = lys_compile_grouping_pathlog(ctx, grp->parent, &path);
    if (len < 0) {
        LOGMEM(ctx->ctx);
        return LY_EMEM;
    }
    strncpy(ctx->path, path, LYSC_CTX_BUFSIZE - 1);
    ctx->path_len = (uint32_t)len;
    free(path);

    lysc_update_path(ctx, NULL, "{grouping}");
    lysc_update_path(ctx, NULL, grp->name);
    rc = lys_compile_uses(ctx, &fake_uses, &fake_container.node, 0, NULL);
    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);

    ctx->path_len = 1;
    ctx->path[1] = '\0';

cleanup:
    lysc_node_container_free(&ctx->free_ctx, &fake_container);
    FREE_ARRAY(&ctx->free_ctx, fake_container.exts, lysc_ext_instance_free);
    return rc;
}